

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_decoder.hpp
# Opt level: O2

void __thiscall
duckdb::DbpDecoder::GetBatchInternal<long,false>
          (DbpDecoder *this,data_ptr_t target_values_ptr,idx_t batch_size)

{
  uint64_t *puVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  idx_t iVar4;
  unsigned_long uVar5;
  ulong uVar6;
  idx_t *piVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  if (batch_size != 0) {
    bVar10 = this->is_first_value == true;
    if (bVar10) {
      *(int64_t *)target_values_ptr = this->previous_value;
      this->is_first_value = false;
    }
    uVar8 = (ulong)bVar10;
    while (uVar6 = batch_size - uVar8, uVar8 <= batch_size && uVar6 != 0) {
      uVar3 = 0x20 - this->unpacked_data_offset;
      if (uVar6 < uVar3) {
        uVar3 = uVar6;
      }
      if (uVar3 == 0) {
        iVar4 = this->miniblock_index;
        if (this->miniblock_offset == this->number_of_values_in_a_miniblock) {
          this->miniblock_offset = 0;
          iVar4 = iVar4 + 1;
          this->miniblock_index = iVar4;
          if (iVar4 == this->number_of_miniblocks_per_block) {
            uVar5 = ParquetDecodeUtils::VarintDecode<unsigned_long,true>(&this->buffer_);
            this->min_delta = -(ulong)((uint)uVar5 & 1) ^ uVar5 >> 1;
            ByteBuffer::available(&this->buffer_,this->number_of_miniblocks_per_block);
            pdVar2 = (this->buffer_).ptr;
            iVar4 = this->number_of_miniblocks_per_block;
            this->list_of_bitwidths_of_miniblocks = pdVar2;
            puVar1 = &(this->buffer_).len;
            *puVar1 = *puVar1 - iVar4;
            (this->buffer_).ptr = pdVar2 + iVar4;
            this->miniblock_index = 0;
            iVar4 = 0;
          }
        }
        ParquetDecodeUtils::BitUnpackAligned<unsigned_long>
                  (&this->buffer_,this->unpacked_data,0x20,
                   this->list_of_bitwidths_of_miniblocks[iVar4]);
        this->unpacked_data_offset = 0;
        uVar3 = 0x20;
        piVar7 = &this->miniblock_offset;
      }
      else {
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          lVar9 = this->min_delta + this->previous_value +
                  this->unpacked_data[this->unpacked_data_offset + uVar6];
          *(long *)(target_values_ptr + uVar6 * 8 + uVar8 * 8) = lVar9;
          this->previous_value = lVar9;
        }
        uVar8 = uVar8 + uVar3;
        piVar7 = &this->unpacked_data_offset;
      }
      *piVar7 = *piVar7 + uVar3;
    }
  }
  return;
}

Assistant:

void GetBatchInternal(const data_ptr_t target_values_ptr, const idx_t batch_size) {
		if (batch_size == 0) {
			return;
		}
		D_ASSERT(target_values_ptr || SKIP_READ);

		T *target_values = nullptr;
		if (!SKIP_READ) {
			target_values = reinterpret_cast<T *>(target_values_ptr);
		}
		idx_t target_values_offset = 0;
		if (is_first_value) {
			if (!SKIP_READ) {
				target_values[0] = static_cast<T>(previous_value);
			}
			target_values_offset++;
			is_first_value = false;
		}

		while (target_values_offset < batch_size) {
			// Copy over any remaining data
			const idx_t next = MinValue(batch_size - target_values_offset,
			                            BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - unpacked_data_offset);
			if (next != 0) {
				for (idx_t i = 0; i < next; i++) {
					const auto &unpacked_value = unpacked_data[unpacked_data_offset + i];
					auto current_value = static_cast<T>(static_cast<uint64_t>(previous_value) +
					                                    static_cast<uint64_t>(min_delta) + unpacked_value);
					if (!SKIP_READ) {
						target_values[target_values_offset + i] = current_value;
					}
					previous_value = static_cast<int64_t>(current_value);
				}
				target_values_offset += next;
				unpacked_data_offset += next;
				continue;
			}

			// Move to next miniblock / block
			D_ASSERT(unpacked_data_offset == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
			D_ASSERT(miniblock_index < number_of_miniblocks_per_block);
			D_ASSERT(miniblock_offset <= number_of_values_in_a_miniblock);
			if (miniblock_offset == number_of_values_in_a_miniblock) {
				miniblock_offset = 0;
				if (++miniblock_index == number_of_miniblocks_per_block) {
					// <min delta> <list of bitwidths of miniblocks> <miniblocks>
					min_delta = ParquetDecodeUtils::ZigzagToInt(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_));
					buffer_.available(number_of_miniblocks_per_block);
					list_of_bitwidths_of_miniblocks = buffer_.ptr;
					buffer_.unsafe_inc(number_of_miniblocks_per_block);
					miniblock_index = 0;
				}
			}

			// Unpack from current miniblock
			ParquetDecodeUtils::BitUnpackAligned(buffer_, unpacked_data,
			                                     BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE,
			                                     list_of_bitwidths_of_miniblocks[miniblock_index]);
			unpacked_data_offset = 0;
			miniblock_offset += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
		}
	}